

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O2

bool deqp::egl::Image::isCompatibleCreateAndRenderActions(Action *create,Action *render)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  
  bVar3 = false;
  lVar2 = __dynamic_cast(create,&Action::typeinfo,&GLES2ImageApi::Create::typeinfo,0);
  if (lVar2 != 0) {
    iVar1 = (**(code **)(**(long **)(lVar2 + 8) + 0x28))();
    lVar2 = __dynamic_cast(render,&Action::typeinfo,&GLES2ImageApi::RenderTexture2D::typeinfo,0);
    if ((lVar2 == 0) || ((bVar3 = false, iVar1 != 0x81a5 && (iVar1 != 0x8d48)))) {
      lVar2 = __dynamic_cast(render,&Action::typeinfo,
                             &GLES2ImageApi::RenderReadPixelsRenderbuffer::typeinfo,0);
      if ((lVar2 == 0) || ((bVar3 = false, iVar1 != 0x81a5 && (iVar1 != 0x8d48)))) {
        bVar3 = false;
        lVar2 = __dynamic_cast(render,&Action::typeinfo,&GLES2ImageApi::RenderDepthbuffer::typeinfo,
                               0);
        if ((iVar1 == 0x81a5) || (lVar2 == 0)) {
          lVar2 = __dynamic_cast(render,&Action::typeinfo,
                                 &GLES2ImageApi::RenderStencilbuffer::typeinfo,0);
          bVar3 = iVar1 == 0x8d48 || lVar2 == 0;
        }
      }
    }
  }
  return bVar3;
}

Assistant:

bool isCompatibleCreateAndRenderActions (const Action& create, const Action& render)
{
	if (const GLES2ImageApi::Create* gles2Create = dynamic_cast<const GLES2ImageApi::Create*>(&create))
	{
		const GLenum createFormat = gles2Create->getEffectiveFormat();

		if (dynamic_cast<const GLES2ImageApi::RenderTexture2D*>(&render))
		{
			// GLES2 does not have depth or stencil textures
			if (isDepthFormat(createFormat) || isStencilFormat(createFormat))
				return false;
		}

		if (dynamic_cast<const GLES2ImageApi::RenderReadPixelsRenderbuffer*>(&render))
		{
			// GLES2 does not support readPixels for depth or stencil
			if (isDepthFormat(createFormat) || isStencilFormat(createFormat))
				return false;
		}

		if (dynamic_cast<const GLES2ImageApi::RenderDepthbuffer*>(&render))
		{
			// Copying non-depth data to depth renderbuffer and expecting meaningful
			// results just doesn't make any sense.
			if (!isDepthFormat(createFormat))
				return false;
		}

		if (dynamic_cast<const GLES2ImageApi::RenderStencilbuffer*>(&render))
		{
			// Copying non-stencil data to stencil renderbuffer and expecting meaningful
			// results just doesn't make any sense.
			if (!isStencilFormat(createFormat))
				return false;
		}

		return true;
	}
	else
		DE_ASSERT(false);

	return false;
}